

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

void rtext_retext(_rtext *x)

{
  t_text *ptVar1;
  char *pcVar2;
  int indx;
  int h;
  int w;
  int local_34 [3];
  
  local_34[2] = 0;
  local_34[1] = 0;
  ptVar1 = x->x_text;
  freebytes(x->x_buf,(long)x->x_bufsize + 1);
  binbuf_gettext(ptVar1->te_binbuf,&x->x_buf,&x->x_bufsize);
  pcVar2 = (char *)resizebytes(x->x_buf,(long)x->x_bufsize,(long)x->x_bufsize + 1);
  x->x_buf = pcVar2;
  pcVar2[x->x_bufsize] = '\0';
  rtext_senditup(x,2,local_34 + 2,local_34 + 1,local_34);
  return;
}

Assistant:

void rtext_retext(t_rtext *x)
{
    int w = 0, h = 0, indx;
    t_text *text = x->x_text;
    t_freebytes(x->x_buf, x->x_bufsize + 1); /* extra 0 byte */
    binbuf_gettext(text->te_binbuf, &x->x_buf, &x->x_bufsize);
        /* allocate extra space for hidden null terminator */
    x->x_buf = resizebytes(x->x_buf, x->x_bufsize, x->x_bufsize+1);
    x->x_buf[x->x_bufsize] = 0;
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}